

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O3

bool rgbcx::unpack_bc1(void *pBlock_bits,void *pPixels,bool set_alpha,bc1_approx_mode mode)

{
  int iVar1;
  ushort uVar2;
  ushort uVar3;
  short sVar4;
  short sVar5;
  uint32_t y;
  uint uVar6;
  uint uVar7;
  long lVar8;
  undefined1 uVar9;
  ulong uVar10;
  undefined1 uVar11;
  int iVar12;
  undefined7 in_register_00000011;
  uint uVar13;
  undefined1 uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  undefined4 local_58;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined4 local_4c;
  ulong local_40;
  undefined4 local_38;
  uint local_34;
  
  local_38 = (int)CONCAT71(in_register_00000011,set_alpha);
  uVar2 = *pBlock_bits;
  uVar3 = *(ushort *)((long)pBlock_bits + 2);
  uVar13 = (uint)(uVar2 >> 0xb);
  uVar6 = uVar2 >> 5 & 0x3f;
  uVar19 = uVar2 & 0x1f;
  iVar17 = (uint)(uVar2 >> 0xd) + uVar13 * 8;
  iVar16 = (uVar6 >> 4) + uVar6 * 4;
  uVar6 = (uVar19 >> 2) + uVar19 * 8;
  uVar7 = (uint)(uVar3 >> 0xb);
  uVar15 = uVar3 >> 5 & 0x3f;
  uVar20 = uVar3 & 0x1f;
  iVar12 = (uVar15 >> 4) + uVar15 * 4;
  iVar18 = (uint)(uVar3 >> 0xd) + uVar7 * 8;
  iVar1 = (uVar20 >> 2) + uVar20 * 8;
  local_58._0_1_ = (char)iVar17;
  local_58._1_1_ = (char)iVar16;
  local_40 = (ulong)uVar6;
  local_58._2_1_ = (char)uVar6;
  local_58._3_1_ = 0xff;
  local_54 = (char)iVar18;
  local_53 = (char)iVar12;
  local_52 = (char)iVar1;
  local_51 = 0xff;
  local_34 = (uint)uVar2;
  if (uVar2 <= uVar3) {
    switch(mode) {
    case cBC1Ideal:
    case cBC1IdealRound4:
      local_4e = (undefined1)(iVar1 + uVar6 >> 1);
      local_50 = (char)((uint)(iVar18 + iVar17) >> 1);
      local_4f = (char)((uint)(iVar12 + iVar16) >> 1);
      break;
    case cBC1NVidia:
      sVar4 = (short)(iVar12 - iVar16);
      sVar5 = sVar4 + 3;
      if (-1 < sVar4) {
        sVar5 = sVar4;
      }
      iVar16 = (iVar12 - iVar16) * 0x80 + iVar16 * 0x100;
      iVar12 = ((int)sVar5 >> 2) + iVar16 + 0x80;
      iVar16 = ((int)sVar5 >> 2) + iVar16 + 0x17f;
      if (-1 < iVar12) {
        iVar16 = iVar12;
      }
      local_4e = (undefined1)((uVar20 + uVar19) * 0x21 >> 3);
      local_50 = (char)((uVar7 + uVar13) * 0x21 >> 3);
      local_4f = (char)((uint)iVar16 >> 8);
      break;
    case cBC1AMD:
      local_4e = (undefined1)(iVar1 + uVar6 + 1 >> 1);
      local_50 = (char)(iVar17 + iVar18 + 1U >> 1);
      local_4f = (char)(iVar16 + iVar12 + 1U >> 1);
      break;
    default:
      goto switchD_0011d39e_default;
    }
    local_4d = 0xff;
switchD_0011d39e_default:
    local_4c = 0;
    goto switchD_0011d3da_default;
  }
  switch(mode) {
  case cBC1Ideal:
    local_50 = (char)((uint)((iVar18 + iVar17 * 2) * 0x5556) >> 0x10);
    local_4f = (char)((uint)((iVar12 + iVar16 * 2) * 0x5556) >> 0x10);
    local_4e = (char)((iVar1 + uVar6 * 2) * 0x5556 >> 0x10);
    local_4d = 0xff;
    uVar9 = (undefined1)((uint)((iVar17 + iVar18 * 2) * 0x5556) >> 0x10);
    uVar11 = (undefined1)((uint)((iVar16 + iVar12 * 2) * 0x5556) >> 0x10);
    uVar14 = (undefined1)((uVar6 + iVar1 * 2) * 0x5556 >> 0x10);
    goto LAB_0011d53c;
  case cBC1NVidia:
    sVar4 = (short)(iVar12 - iVar16);
    sVar5 = sVar4 + 3;
    if (-1 < sVar4) {
      sVar5 = sVar4;
    }
    iVar17 = (iVar12 - iVar16) * 0x50 + iVar16 * 0x100 + ((int)sVar5 >> 2);
    iVar1 = iVar17 + 0x80;
    iVar17 = iVar17 + 0x17f;
    if (-1 < iVar1) {
      iVar17 = iVar1;
    }
    local_50 = (char)((uVar7 + uVar13 * 2) * 0x16 >> 3);
    local_4f = (char)((uint)iVar17 >> 8);
    local_4e = (char)((uVar20 + uVar19 * 2) * 0x16 >> 3);
    local_4d = 0xff;
    sVar4 = (short)(iVar16 - iVar12);
    sVar5 = sVar4 + 3;
    if (-1 < sVar4) {
      sVar5 = sVar4;
    }
    iVar16 = (iVar16 - iVar12) * 0x50 + iVar12 * 0x100 + ((int)sVar5 >> 2);
    iVar12 = iVar16 + 0x80;
    iVar16 = iVar16 + 0x17f;
    if (-1 < iVar12) {
      iVar16 = iVar12;
    }
    local_4c = CONCAT13(0xff,CONCAT12((char)((uVar19 + uVar20 * 2) * 0x16 >> 3),
                                      CONCAT11((char)((uint)iVar16 >> 8),
                                               (char)((uVar13 + uVar7 * 2) * 0x16 >> 3))));
    break;
  case cBC1AMD:
    local_50 = (char)(iVar17 * 0x2b + iVar18 * 0x15 + 0x20U >> 6);
    local_4f = (char)(iVar16 * 0x2b + iVar12 * 0x15 + 0x20U >> 6);
    local_4e = (char)(uVar6 * 0x2b + iVar1 * 0x15 + 0x20 >> 6);
    local_4d = 0xff;
    uVar9 = (undefined1)(iVar18 * 0x2b + iVar17 * 0x15 + 0x20U >> 6);
    uVar11 = (undefined1)(iVar12 * 0x2b + iVar16 * 0x15 + 0x20U >> 6);
    uVar14 = (undefined1)(iVar1 * 0x2b + uVar6 * 0x15 + 0x20 >> 6);
LAB_0011d53c:
    local_4c._0_2_ = CONCAT11(uVar11,uVar9);
    local_4c._0_3_ = CONCAT12(uVar14,(undefined2)local_4c);
    local_4c = CONCAT13(0xff,(undefined3)local_4c);
    break;
  case cBC1IdealRound4:
    local_50 = (char)((uint)((iVar18 + iVar17 * 2) * 0x5556 + 0x5556) >> 0x10);
    local_4f = (char)((uint)((iVar12 + iVar16 * 2) * 0x5556 + 0x5556) >> 0x10);
    local_4e = (char)((iVar1 + uVar6 * 2) * 0x5556 + 0x5556 >> 0x10);
    local_4d = 0xff;
    local_4c._0_2_ =
         CONCAT11((char)((uint)((iVar16 + iVar12 * 2) * 0x5556 + 0x5556) >> 0x10),
                  (char)((uint)((iVar17 + iVar18 * 2) * 0x5556 + 0x5556) >> 0x10));
    local_4c._0_3_ =
         CONCAT12((char)((uVar6 + iVar1 * 2) * 0x5556 + 0x5556 >> 0x10),(undefined2)local_4c);
    local_4c = CONCAT13(0xff,(undefined3)local_4c);
  }
switchD_0011d3da_default:
  if (set_alpha) {
    lVar8 = 0;
    do {
      *(undefined4 *)pPixels = (&local_58)[*(byte *)((long)pBlock_bits + lVar8 + 4) & 3];
      *(undefined4 *)((long)pPixels + 4) =
           *(undefined4 *)
            ((long)&local_58 + (ulong)(*(byte *)((long)pBlock_bits + lVar8 + 4) & 0xc));
      *(undefined4 *)((long)pPixels + 8) =
           *(undefined4 *)
            ((long)&local_58 + (ulong)(*(byte *)((long)pBlock_bits + lVar8 + 4) >> 2 & 0xc));
      *(undefined4 *)((long)pPixels + 0xc) =
           (&local_58)[*(byte *)((long)pBlock_bits + lVar8 + 4) >> 6];
      lVar8 = lVar8 + 1;
      pPixels = (void *)((long)pPixels + 0x10);
    } while (lVar8 != 4);
  }
  else {
    lVar8 = 0;
    do {
      uVar10 = (ulong)(*(byte *)((long)pBlock_bits + lVar8 + 4) & 3);
      *(undefined1 *)pPixels = *(undefined1 *)(&local_58 + uVar10);
      *(undefined1 *)((long)pPixels + 1) = *(undefined1 *)((long)&local_58 + uVar10 * 4 + 1);
      *(undefined1 *)((long)pPixels + 2) = *(undefined1 *)((long)&local_58 + uVar10 * 4 + 2);
      uVar10 = (ulong)(*(byte *)((long)pBlock_bits + lVar8 + 4) & 0xc);
      *(undefined1 *)((long)pPixels + 4) = *(undefined1 *)((long)&local_58 + uVar10);
      *(undefined1 *)((long)pPixels + 5) = *(undefined1 *)((long)&local_58 + uVar10 + 1);
      *(undefined1 *)((long)pPixels + 6) = *(undefined1 *)((long)&local_58 + uVar10 + 2);
      uVar10 = (ulong)(*(byte *)((long)pBlock_bits + lVar8 + 4) >> 2 & 0xc);
      *(undefined1 *)((long)pPixels + 8) = *(undefined1 *)((long)&local_58 + uVar10);
      *(undefined1 *)((long)pPixels + 9) = *(undefined1 *)((long)&local_58 + uVar10 + 1);
      *(undefined1 *)((long)pPixels + 10) = *(undefined1 *)((long)&local_58 + uVar10 + 2);
      uVar10 = (ulong)(*(byte *)((long)pBlock_bits + lVar8 + 4) >> 6);
      *(undefined1 *)((long)pPixels + 0xc) = *(undefined1 *)(&local_58 + uVar10);
      *(undefined1 *)((long)pPixels + 0xd) = *(undefined1 *)((long)&local_58 + uVar10 * 4 + 1);
      *(undefined1 *)((long)pPixels + 0xe) = *(undefined1 *)((long)&local_58 + uVar10 * 4 + 2);
      lVar8 = lVar8 + 1;
      pPixels = (void *)((long)pPixels + 0x10);
    } while (lVar8 != 4);
  }
  return uVar2 <= uVar3;
}

Assistant:

bool unpack_bc1(const void* pBlock_bits, void* pPixels, bool set_alpha, bc1_approx_mode mode)
	{
		color32* pDst_pixels = static_cast<color32*>(pPixels);

		static_assert(sizeof(bc1_block) == 8, "sizeof(bc1_block) == 8");
		static_assert(sizeof(bc4_block) == 8, "sizeof(bc4_block) == 8");

		const bc1_block* pBlock = static_cast<const bc1_block*>(pBlock_bits);

		const uint32_t l = pBlock->get_low_color();
		const uint32_t h = pBlock->get_high_color();

		color32 c[4];

		const int cr0 = (l >> 11) & 31;
		const int cg0 = (l >> 5) & 63;
		const int cb0 = l & 31;
		const int r0 = (cr0 << 3) | (cr0 >> 2);
		const int g0 = (cg0 << 2) | (cg0 >> 4);
		const int b0 = (cb0 << 3) | (cb0 >> 2);

		const int cr1 = (h >> 11) & 31;
		const int cg1 = (h >> 5) & 63;
		const int cb1 = h & 31;
		const int r1 = (cr1 << 3) | (cr1 >> 2);
		const int g1 = (cg1 << 2) | (cg1 >> 4);
		const int b1 = (cb1 << 3) | (cb1 >> 2);

		bool used_punchthrough = false;
				
		if (l > h)
		{
			c[0].set_noclamp_rgba(r0, g0, b0, 255);
			c[1].set_noclamp_rgba(r1, g1, b1, 255);
			switch (mode)
			{
				case bc1_approx_mode::cBC1Ideal:
					c[2].set_noclamp_rgba((r0 * 2 + r1) / 3, (g0 * 2 + g1) / 3, (b0 * 2 + b1) / 3, 255);
					c[3].set_noclamp_rgba((r1 * 2 + r0) / 3, (g1 * 2 + g0) / 3, (b1 * 2 + b0) / 3, 255);
					break;
				case bc1_approx_mode::cBC1IdealRound4:
					c[2].set_noclamp_rgba((r0 * 2 + r1 + 1) / 3, (g0 * 2 + g1 + 1) / 3, (b0 * 2 + b1 + 1) / 3, 255);
					c[3].set_noclamp_rgba((r1 * 2 + r0 + 1) / 3, (g1 * 2 + g0 + 1) / 3, (b1 * 2 + b0 + 1) / 3, 255);
					break;
				case bc1_approx_mode::cBC1NVidia:
					c[2].set_noclamp_rgba(interp_5_nv(cr0, cr1), interp_6_nv(g0, g1), interp_5_nv(cb0, cb1), 255);
					c[3].set_noclamp_rgba(interp_5_nv(cr1, cr0), interp_6_nv(g1, g0), interp_5_nv(cb1, cb0), 255);
					break;
				case bc1_approx_mode::cBC1AMD:
					c[2].set_noclamp_rgba(interp_5_6_amd(r0, r1), interp_5_6_amd(g0, g1), interp_5_6_amd(b0, b1), 255);
					c[3].set_noclamp_rgba(interp_5_6_amd(r1, r0), interp_5_6_amd(g1, g0), interp_5_6_amd(b1, b0), 255);
					break;
			}
		}
		else
		{
			c[0].set_noclamp_rgba(r0, g0, b0, 255);
			c[1].set_noclamp_rgba(r1, g1, b1, 255);
			switch (mode)
			{
				case bc1_approx_mode::cBC1Ideal:
				case bc1_approx_mode::cBC1IdealRound4:
					c[2].set_noclamp_rgba((r0 + r1) / 2, (g0 + g1) / 2, (b0 + b1) / 2, 255);
					break;
				case bc1_approx_mode::cBC1NVidia:
					c[2].set_noclamp_rgba(interp_half_5_nv(cr0, cr1), interp_half_6_nv(g0, g1), interp_half_5_nv(cb0, cb1), 255);
					break;
				case bc1_approx_mode::cBC1AMD:
					c[2].set_noclamp_rgba(interp_half_5_6_amd(r0, r1), interp_half_5_6_amd(g0, g1), interp_half_5_6_amd(b0, b1), 255);
					break;
			}

			c[3].set_noclamp_rgba(0, 0, 0, 0);
			used_punchthrough = true;
		}

		if (set_alpha)
		{
			for (uint32_t y = 0; y < 4; y++, pDst_pixels += 4)
			{
				pDst_pixels[0] = c[pBlock->get_selector(0, y)];
				pDst_pixels[1] = c[pBlock->get_selector(1, y)];
				pDst_pixels[2] = c[pBlock->get_selector(2, y)];
				pDst_pixels[3] = c[pBlock->get_selector(3, y)];
			}
		}
		else
		{
			for (uint32_t y = 0; y < 4; y++, pDst_pixels += 4)
			{
				pDst_pixels[0].set_rgb(c[pBlock->get_selector(0, y)]);
				pDst_pixels[1].set_rgb(c[pBlock->get_selector(1, y)]);
				pDst_pixels[2].set_rgb(c[pBlock->get_selector(2, y)]);
				pDst_pixels[3].set_rgb(c[pBlock->get_selector(3, y)]);
			}
		}

		return used_punchthrough;
	}